

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pagerOpentemp(Pager *pPager,sqlite3_file *pFile,int vfsFlags)

{
  int iVar1;
  int rc;
  int vfsFlags_local;
  sqlite3_file *pFile_local;
  Pager *pPager_local;
  
  iVar1 = sqlite3OsOpen(pPager->pVfs,(char *)0x0,pFile,vfsFlags | 0x1e,(int *)0x0);
  return iVar1;
}

Assistant:

static int pagerOpentemp(
  Pager *pPager,        /* The pager object */
  sqlite3_file *pFile,  /* Write the file descriptor here */
  int vfsFlags          /* Flags passed through to the VFS */
){
  int rc;               /* Return code */

#ifdef SQLITE_TEST
  sqlite3_opentemp_count++;  /* Used for testing and analysis only */
#endif

  vfsFlags |=  SQLITE_OPEN_READWRITE | SQLITE_OPEN_CREATE |
            SQLITE_OPEN_EXCLUSIVE | SQLITE_OPEN_DELETEONCLOSE;
  rc = sqlite3OsOpen(pPager->pVfs, 0, pFile, vfsFlags, 0);
  assert( rc!=SQLITE_OK || isOpen(pFile) );
  return rc;
}